

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
::operator()(gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
             *this,double *blockB,const_blas_data_mapper<double,_long,_0> *rhs,long depth,long cols,
            long stride,long offset)

{
  bool bVar1;
  double *pdVar2;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long k_1;
  LinearMapper dm0_1;
  long j2_1;
  long k;
  LinearMapper dm3;
  LinearMapper dm2;
  LinearMapper dm1;
  LinearMapper dm0;
  long j2;
  long peeled_k;
  long count;
  long packet_cols4;
  long packet_cols8;
  conj_if<false> cj;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  undefined8 local_1f8;
  conj_if<false> local_1e9;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1b8;
  undefined8 local_1b0;
  long *local_1a8;
  undefined1 local_1a0 [8];
  long local_198;
  undefined8 local_190;
  long *local_188;
  long local_180;
  undefined8 local_178;
  long *local_170;
  undefined1 local_168 [8];
  long local_160;
  undefined8 local_158;
  long *local_150;
  long local_148;
  undefined8 local_140;
  long *local_138;
  undefined1 local_130 [8];
  long local_128;
  undefined8 local_120;
  long *local_118;
  long local_110;
  undefined8 local_108;
  long *local_100;
  undefined1 local_f8 [8];
  long local_f0;
  undefined8 local_e8;
  long *local_e0;
  long local_d8;
  undefined8 local_d0;
  long *local_c8;
  undefined1 local_c0 [8];
  long local_b8;
  undefined8 local_b0;
  long *local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  long *local_88;
  long local_80;
  long *local_78;
  long local_70;
  long *local_68;
  long local_60;
  long *local_58;
  long local_50;
  undefined1 *local_48;
  long local_40;
  undefined1 *local_38;
  long local_30;
  undefined1 *local_28;
  long local_20;
  undefined1 *local_18;
  long local_10;
  undefined1 *local_8;
  
  local_1e8 = in_R9;
  local_1e0 = in_R8;
  local_1d8 = in_RCX;
  local_1d0 = in_RDX;
  local_1c8 = in_RSI;
  ignore_unused_variable<long>(&local_1e8);
  ignore_unused_variable<long>(&stack0x00000008);
  if ((local_1e8 != 0) || (bVar1 = true, in_stack_00000008 != 0)) {
    bVar1 = false;
  }
  if (!bVar1) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x779,
                  "void Eigen::internal::gemm_pack_rhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 0>, 4, 0>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 0>, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = false]"
                 );
  }
  local_1f8 = 0;
  local_200 = local_1e0 / 4 << 2;
  local_208 = 0;
  local_210 = local_1d8 / 2 << 1;
  for (local_218 = 0; local_218 < local_200; local_218 = local_218 + 4) {
    local_c8 = local_1d0;
    local_d0 = 0;
    local_d8 = local_218;
    local_a8 = local_1d0;
    local_b0 = 0;
    local_b8 = local_218;
    local_220 = *local_1d0 + local_218 * local_1d0[1] * 8;
    local_48 = local_c0;
    local_110 = local_218 + 1;
    local_100 = local_1d0;
    local_108 = 0;
    local_e0 = local_1d0;
    local_e8 = 0;
    local_228 = *local_1d0 + local_110 * local_1d0[1] * 8;
    local_38 = local_f8;
    local_148 = local_218 + 2;
    local_138 = local_1d0;
    local_140 = 0;
    local_118 = local_1d0;
    local_120 = 0;
    local_230 = *local_1d0 + local_148 * local_1d0[1] * 8;
    local_28 = local_130;
    local_180 = local_218 + 3;
    local_170 = local_1d0;
    local_178 = 0;
    local_150 = local_1d0;
    local_158 = 0;
    local_238 = *local_1d0 + local_180 * local_1d0[1] * 8;
    local_18 = local_168;
    local_160 = local_180;
    local_128 = local_148;
    local_f0 = local_110;
    local_50 = local_220;
    local_40 = local_228;
    local_30 = local_230;
    local_20 = local_238;
    for (local_240 = 0; local_240 < local_1d8; local_240 = local_240 + 1) {
      local_58 = &local_220;
      local_60 = local_240;
      pdVar2 = conj_if<false>::operator()(&local_1e9,(double *)(local_220 + local_240 * 8));
      *(double *)(local_1c8 + local_208 * 8) = *pdVar2;
      local_68 = &local_228;
      local_70 = local_240;
      pdVar2 = conj_if<false>::operator()(&local_1e9,(double *)(local_228 + local_240 * 8));
      *(double *)(local_1c8 + 8 + local_208 * 8) = *pdVar2;
      local_78 = &local_230;
      local_80 = local_240;
      pdVar2 = conj_if<false>::operator()(&local_1e9,(double *)(local_230 + local_240 * 8));
      *(double *)(local_1c8 + 0x10 + local_208 * 8) = *pdVar2;
      local_88 = &local_238;
      local_90 = local_240;
      pdVar2 = conj_if<false>::operator()(&local_1e9,(double *)(local_238 + local_240 * 8));
      *(double *)(local_1c8 + 0x18 + local_208 * 8) = *pdVar2;
      local_208 = local_208 + 4;
    }
  }
  for (local_248 = local_200; local_248 < local_1e0; local_248 = local_248 + 1) {
    local_1a8 = local_1d0;
    local_1b0 = 0;
    local_1b8 = local_248;
    local_188 = local_1d0;
    local_190 = 0;
    local_198 = local_248;
    local_250 = *local_1d0 + local_248 * local_1d0[1] * 8;
    local_8 = local_1a0;
    local_10 = local_250;
    for (local_258 = 0; local_258 < local_1d8; local_258 = local_258 + 1) {
      local_98 = &local_250;
      local_a0 = local_258;
      pdVar2 = conj_if<false>::operator()(&local_1e9,(double *)(local_250 + local_258 * 8));
      *(double *)(local_1c8 + local_208 * 8) = *pdVar2;
      local_208 = local_208 + 1;
    }
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;
  const Index peeled_k = (depth/PacketSize)*PacketSize;
//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       const Scalar* b0 = &rhs[(j2+0)*rhsStride];
//       const Scalar* b1 = &rhs[(j2+1)*rhsStride];
//       const Scalar* b2 = &rhs[(j2+2)*rhsStride];
//       const Scalar* b3 = &rhs[(j2+3)*rhsStride];
//       const Scalar* b4 = &rhs[(j2+4)*rhsStride];
//       const Scalar* b5 = &rhs[(j2+5)*rhsStride];
//       const Scalar* b6 = &rhs[(j2+6)*rhsStride];
//       const Scalar* b7 = &rhs[(j2+7)*rhsStride];
//       Index k=0;
//       if(PacketSize==8) // TODO enbale vectorized transposition for PacketSize==4
//       {
//         for(; k<peeled_k; k+=PacketSize) {
//           PacketBlock<Packet> kernel;
//           for (int p = 0; p < PacketSize; ++p) {
//             kernel.packet[p] = ploadu<Packet>(&rhs[(j2+p)*rhsStride+k]);
//           }
//           ptranspose(kernel);
//           for (int p = 0; p < PacketSize; ++p) {
//             pstoreu(blockB+count, cj.pconj(kernel.packet[p]));
//             count+=PacketSize;
//           }
//         }
//       }
//       for(; k<depth; k++)
//       {
//         blockB[count+0] = cj(b0[k]);
//         blockB[count+1] = cj(b1[k]);
//         blockB[count+2] = cj(b2[k]);
//         blockB[count+3] = cj(b3[k]);
//         blockB[count+4] = cj(b4[k]);
//         blockB[count+5] = cj(b5[k]);
//         blockB[count+6] = cj(b6[k]);
//         blockB[count+7] = cj(b7[k]);
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }

  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      const LinearMapper dm0 = rhs.getLinearMapper(0, j2 + 0);
      const LinearMapper dm1 = rhs.getLinearMapper(0, j2 + 1);
      const LinearMapper dm2 = rhs.getLinearMapper(0, j2 + 2);
      const LinearMapper dm3 = rhs.getLinearMapper(0, j2 + 3);

      Index k=0;
      if((PacketSize%4)==0) // TODO enable vectorized transposition for PacketSize==2 ??
      {
        for(; k<peeled_k; k+=PacketSize) {
          PacketBlock<Packet,(PacketSize%4)==0?4:PacketSize> kernel;
          kernel.packet[0] = dm0.loadPacket(k);
          kernel.packet[1%PacketSize] = dm1.loadPacket(k);
          kernel.packet[2%PacketSize] = dm2.loadPacket(k);
          kernel.packet[3%PacketSize] = dm3.loadPacket(k);
          ptranspose(kernel);
          pstoreu(blockB+count+0*PacketSize, cj.pconj(kernel.packet[0]));
          pstoreu(blockB+count+1*PacketSize, cj.pconj(kernel.packet[1%PacketSize]));
          pstoreu(blockB+count+2*PacketSize, cj.pconj(kernel.packet[2%PacketSize]));
          pstoreu(blockB+count+3*PacketSize, cj.pconj(kernel.packet[3%PacketSize]));
          count+=4*PacketSize;
        }
      }
      for(; k<depth; k++)
      {
        blockB[count+0] = cj(dm0(k));
        blockB[count+1] = cj(dm1(k));
        blockB[count+2] = cj(dm2(k));
        blockB[count+3] = cj(dm3(k));
        count += 4;
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const LinearMapper dm0 = rhs.getLinearMapper(0, j2);
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(dm0(k));
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}